

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_extract2(REF_DBL *m,REF_DBL *r,REF_DBL *s,REF_DBL *e)

{
  long lVar1;
  REF_DBL q [9];
  REF_DBL m3 [6];
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    q[lVar1] = r[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    q[lVar1 + 3] = s[lVar1];
  }
  for (lVar1 = 6; lVar1 != 9; lVar1 = lVar1 + 1) {
    q[lVar1] = 0.0;
  }
  ref_matrix_jac_m_jact(q,m,m3);
  *e = m3[0];
  e[1] = m3[1];
  e[2] = m3[3];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_extract2(REF_DBL *m, REF_DBL *r, REF_DBL *s,
                                       REF_DBL *e) {
  REF_DBL q[9];
  REF_DBL m3[6];
  REF_INT i;
  for (i = 0; i < 3; i++) q[i] = r[i];
  for (i = 0; i < 3; i++) q[i + 3] = s[i];
  for (i = 0; i < 3; i++) q[i + 6] = 0;
  RSS(ref_matrix_jac_m_jact(q, m, m3), "trans");
  e[0] = m3[0];
  e[1] = m3[1];
  e[2] = m3[3];
  return REF_SUCCESS;
}